

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O2

bool __thiscall
GrcManager::AddFeatsModFamilyAux
          (GrcManager *this,uint8 *pTblOld,size_t param_2,uint8 *pTblNew,size_t param_4,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *vstuExtNames,vector<unsigned_short,_std::allocator<unsigned_short>_> *vnLangIds,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vnNameTblIds,
          uint16 *pchwFamilyName,size_t cchwFamilyName,
          vector<PlatEncChange,_std::allocator<PlatEncChange>_> *vpec,size_t nNameTblMinNew)

{
  undefined2 uVar1;
  pointer pPVar2;
  pointer pbVar3;
  uint8 *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  pointer pPVar9;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar10;
  ushort uVar11;
  long lVar12;
  u16string *puVar13;
  size_t src_len;
  ulong uVar14;
  ushort uVar15;
  ulong uVar16;
  pointer src;
  string *staMsg;
  ushort uVar17;
  uint8 *dest;
  int iVar18;
  ushort *puVar19;
  uint8 *puVar20;
  uint16 dibNew;
  allocator local_5b1;
  uint8 *local_5b0;
  uint8 *local_5a8;
  ulong local_5a0;
  ulong local_598;
  ulong local_590;
  uint8 *local_588;
  uint8 *local_580;
  uint8 *local_578;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_570;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vdibOffsets16;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vdibOffsets8;
  wstring stuWchar;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  string local_498;
  string local_478;
  string local_458;
  utf16 rgch16 [512];
  
  uVar17 = *(ushort *)(pTblOld + 2) << 8 | *(ushort *)(pTblOld + 2) >> 8;
  local_5a8 = (uint8 *)(ulong)uVar17;
  uVar11 = *(ushort *)(pTblOld + 4);
  local_5b0 = pTblOld + 6;
  uVar5 = (int)(((long)(vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x70) *
          ((uint)(*(int *)&(vstuExtNames->
                           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                 *(int *)&(vstuExtNames->
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 5) + (uint)uVar17;
  *(undefined2 *)pTblNew = *(undefined2 *)pTblOld;
  *(ushort *)(pTblNew + 2) = (ushort)uVar5 << 8 | (ushort)uVar5 >> 8;
  uVar6 = uVar5 * 0xc + 6;
  uVar17 = (ushort)uVar6;
  *(ushort *)(pTblNew + 4) = uVar17 << 8 | uVar17 >> 8;
  dibNew = 0;
  local_578 = pTblNew + 6;
  dest = pTblNew + (uVar6 & 0xffff);
  local_588 = pTblOld + (ushort)(uVar11 << 8 | uVar11 >> 8);
  puVar20 = (uint8 *)0x0;
  iVar18 = 0;
  uVar14 = 0;
  local_580 = pTblNew;
  local_570 = vstuExtNames;
  do {
    puVar4 = local_578;
    if (puVar20 == local_5a8) {
      vdibOffsets8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdibOffsets16.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vdibOffsets8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vdibOffsets8.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vdibOffsets16.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vdibOffsets16.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_580 = local_580 + 0x10;
      lVar12 = 0;
      local_590 = 0;
      local_598 = 0;
      puVar20 = local_5a8;
      do {
        pPVar2 = (vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)(((long)(vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>).
                         _M_impl.super__Vector_impl_data._M_finish - (long)pPVar2) / 0x70) <= lVar12
           ) {
          qsort(local_578,(ulong)uVar5 & 0xffff,0xc,AddFeatsModFamilyAux::NameTblEntry::Compare);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&vdibOffsets16.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
          std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                    (&vdibOffsets8.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
          return true;
        }
        pPVar9 = pPVar2 + lVar12;
        local_5a0 = pPVar2[lVar12].cbBytesPerChar;
        local_5a8 = (uint8 *)(long)(int)puVar20;
        puVar19 = (ushort *)(local_580 + (long)local_5a8 * 0xc);
        local_5b0 = (uint8 *)0x0;
        for (puVar20 = (uint8 *)0x0;
            pbVar3 = (local_570->
                     super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
            puVar20 < (uint8 *)((long)(local_570->
                                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >>
                               5); puVar20 = puVar20 + 1) {
          uVar1 = pPVar9->platformID;
          puVar19[-5] = uVar1 << 8 | (ushort)uVar1 >> 8;
          uVar11 = pPVar9->encodingID;
          puVar19[-4] = uVar11 << 8 | uVar11 >> 8;
          uVar17 = (vnLangIds->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_start[(long)puVar20];
          puVar19[-3] = uVar17 << 8 | uVar17 >> 8;
          uVar15 = (vnNameTblIds->
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                   super__Vector_impl_data._M_start[(long)puVar20];
          puVar19[-2] = uVar15 << 8 | uVar15 >> 8;
          uVar14 = pPVar9->cbBytesPerChar * *(long *)(local_5b0 + (long)&pbVar3->_M_string_length);
          uVar6 = (uint)uVar17;
          local_588 = puVar20;
          if (uVar1 == 1 && uVar11 == 0) {
            if (uVar6 != 0x409) {
              std::__cxx11::string::string
                        ((string *)&local_478,"Windows language ID ",(allocator *)&stuWchar);
              std::__cxx11::to_string(&local_498,uVar6);
              std::__cxx11::string::string
                        ((string *)&local_4b8,
                         " cannot be converted to Macintosh; 0 (English) will be used",&local_5b1);
              staMsg = &local_478;
              GrcErrorList::AddWarning
                        (&g_errorList,0x1582,(GdlObject *)0x0,staMsg,&local_498,&local_4b8);
              std::__cxx11::string::~string((string *)&local_4b8);
              std::__cxx11::string::~string((string *)&local_498);
LAB_00192868:
              std::__cxx11::string::~string((string *)staMsg);
            }
LAB_0019286d:
            puVar19[-3] = 0;
          }
          else if (uVar11 == 3 && uVar1 == 0) {
            if (uVar17 != 0x409) {
              std::__cxx11::string::string
                        ((string *)&local_4d8,"Windows language ID ",(allocator *)&stuWchar);
              std::__cxx11::to_string(&local_4f8,uVar6);
              std::__cxx11::string::string
                        ((string *)&local_458,
                         " cannot be translated to Unicode 2.0; language 0 will be used",&local_5b1)
              ;
              staMsg = &local_4d8;
              GrcErrorList::AddWarning
                        (&g_errorList,0x1583,(GdlObject *)0x0,staMsg,&local_4f8,&local_458);
              std::__cxx11::string::~string((string *)&local_458);
              std::__cxx11::string::~string((string *)&local_4f8);
              goto LAB_00192868;
            }
            goto LAB_0019286d;
          }
          std::__cxx11::wstring::wstring
                    ((wstring *)&stuWchar,
                     (wstring *)
                     (local_5b0 +
                     (long)(local_570->
                           super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start));
          std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<wchar_t_const*,unsigned_short*>
                    (stuWchar._M_dataplus._M_p,stuWchar._M_dataplus._M_p + stuWchar._M_string_length
                     ,rgch16);
          uVar11 = (ushort)uVar14;
          if (local_5a0 == 2) {
            if ((local_598 & 1) == 0) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                        (&vdibOffsets16,&dibNew);
              uVar14 = uVar14 & 0xffff;
              memcpy(dest,rgch16,uVar14);
              TtfUtil::SwapWString(dest,uVar14 >> 1);
              dibNew = dibNew + uVar11;
              dest = dest + uVar14;
            }
            pvVar10 = &vdibOffsets16;
          }
          else {
            if ((local_590 & 1) == 0) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                        (&vdibOffsets8,&dibNew);
              uVar14 = uVar14 & 0xffff;
              gr::Platform_UnicodeToANSI(rgch16,uVar14,(char *)dest,uVar14);
              dibNew = dibNew + uVar11;
              dest = dest + uVar14;
            }
            pvVar10 = &vdibOffsets8;
          }
          puVar20 = local_588;
          puVar19[-1] = uVar11 << 8 | uVar11 >> 8;
          uVar11 = (pvVar10->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                   _M_impl.super__Vector_impl_data._M_start[(long)local_588];
          *puVar19 = uVar11 << 8 | uVar11 >> 8;
          std::__cxx11::wstring::~wstring((wstring *)&stuWchar);
          puVar19 = puVar19 + 6;
          local_5b0 = local_5b0 + 0x20;
        }
        local_590 = CONCAT71((int7)(local_590 >> 8),(byte)local_590 | local_5a0 != 2);
        local_598 = CONCAT71((int7)(local_598 >> 8),(byte)local_598 | local_5a0 == 2);
        lVar12 = lVar12 + 1;
        puVar20 = local_5a8 + (long)puVar20;
      } while( true );
    }
    pPVar2 = (vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = ((long)(vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pPVar2) / 0x70;
    lVar12 = (long)puVar20 * 0xc;
    puVar19 = (ushort *)(local_5b0 + lVar12);
    uVar16 = (ulong)(int)uVar14;
    iVar7 = (int)uVar8;
    uVar8 = uVar8 & 0xffffffff;
    if (iVar7 < (int)uVar14) {
      uVar8 = uVar14;
    }
    uVar11 = *(ushort *)(local_5b0 + lVar12);
    uVar17 = uVar11 << 8 | uVar11 >> 8;
    pPVar9 = pPVar2 + uVar16;
    for (; (long)uVar16 < (long)iVar7; uVar16 = uVar16 + 1) {
      if (uVar17 <= pPVar9->platformID) {
        uVar15 = puVar19[1];
        if (pPVar9->platformID != uVar17) {
          uVar14 = uVar16 & 0xffffffff;
          goto LAB_00192470;
        }
        uVar14 = uVar16 & 0xffffffff;
        if ((ushort)(uVar15 << 8 | uVar15 >> 8) <= pPVar9->encodingID) goto LAB_00192470;
      }
      pPVar9 = pPVar9 + 1;
    }
    uVar15 = puVar19[1];
    uVar14 = uVar8;
LAB_00192470:
    *(ushort *)(local_578 + lVar12) = uVar11;
    *(ushort *)(local_578 + lVar12 + 2) = uVar15;
    *(undefined4 *)(local_578 + lVar12 + 4) = *(undefined4 *)(puVar19 + 2);
    *(ushort *)(local_578 + lVar12 + 8) = puVar19[4];
    if (((((long)iVar7 <= (long)uVar16) || ((pPVar9->stuFullName)._M_string_length == 0)) ||
        (pPVar9->platformID != (uint16)(*puVar19 << 8 | *puVar19 >> 8))) ||
       ((pPVar9->encodingID != (uint16)(puVar19[1] << 8 | puVar19[1] >> 8) ||
        (pPVar9->engLangID != (uint16)(puVar19[2] << 8 | puVar19[2] >> 8)))))
    goto switchD_00192517_caseD_2;
    uVar11 = puVar19[3] << 8 | puVar19[3] >> 8;
    iVar7 = (int)uVar14;
    src_len = cchwFamilyName;
    src = (pointer)pchwFamilyName;
    switch(uVar11) {
    case 1:
      goto switchD_00192517_caseD_1;
    case 2:
    case 5:
      goto switchD_00192517_caseD_2;
    case 3:
      puVar13 = &pPVar2[iVar7].stuUniqueName;
      break;
    case 4:
switchD_00192517_caseD_4:
      puVar13 = &pPVar2[iVar7].stuFullName;
      break;
    case 6:
      puVar13 = &pPVar2[iVar7].stuPostscriptName;
      break;
    default:
      if (uVar11 == 0xf) goto switchD_00192517_caseD_1;
      if (uVar11 == 0x11) goto switchD_00192517_caseD_4;
      goto switchD_00192517_caseD_2;
    }
    src = (puVar13->_M_dataplus)._M_p;
    src_len = puVar13->_M_string_length;
switchD_00192517_caseD_1:
    if (src == (pointer)0x0) {
switchD_00192517_caseD_2:
      uVar11 = puVar19[4] << 8 | puVar19[4] >> 8;
      uVar6 = (uint)uVar11;
      memcpy(dest,local_588 + (ushort)(puVar19[5] << 8 | puVar19[5] >> 8),(ulong)uVar11);
    }
    else {
      uVar8 = pPVar2[iVar7].cbBytesPerChar * src_len;
      uVar6 = (uint)uVar8;
      *(ushort *)(local_578 + lVar12 + 8) = (ushort)uVar8 << 8 | (ushort)uVar8 >> 8;
      if (pPVar9->cbBytesPerChar == 2) {
        local_5a0 = uVar8 & 0xffff;
        memcpy(dest,src,local_5a0);
        TtfUtil::SwapWString(dest,local_5a0 >> 1 & 0x7fffffff);
      }
      else {
        gr::Platform_UnicodeToANSI((utf16 *)src,src_len,(char *)dest,src_len);
      }
    }
    *(ushort *)(puVar4 + lVar12 + 10) = (ushort)iVar18 << 8 | (ushort)iVar18 >> 8;
    iVar18 = iVar18 + uVar6;
    dibNew = (uint16)iVar18;
    dest = dest + (uVar6 & 0xffff);
    puVar20 = puVar20 + 1;
  } while( true );
}

Assistant:

bool GrcManager::AddFeatsModFamilyAux(uint8 * pTblOld, size_t /*cbTblOld*/, 
	uint8 * pTblNew, size_t /*cbTblNew*/,
	std::vector<std::wstring> & vstuExtNames, std::vector<uint16> & vnLangIds,
	std::vector<uint16> & vnNameTblIds, 
	uint16 * pchwFamilyName, size_t cchwFamilyName, std::vector<PlatEncChange> & vpec,
	size_t nNameTblMinNew)
{
    #pragma pack(1)
	// Struct used to store data from directory entries that need to be sorted.
	// Must match the NameRecord struct exactly.
	struct NameTblEntry
	{
		uint16 nPlatId;
		uint16 nEncId;
		uint16 nLangId;
		uint16 nNameId;
		uint16 cLength;
		uint16 ibOffset;
		static int Compare(const void * ptr1, const void * ptr2)
		{
			NameTblEntry * p1 = (NameTblEntry *) ptr1;
			NameTblEntry * p2 = (NameTblEntry *) ptr2;

			if (p1->nPlatId != p2->nPlatId)
				return read(p1->nPlatId) - read(p2->nPlatId);
			else if (p1->nEncId != p2->nEncId)
				return read(p1->nEncId) - read(p2->nEncId);
			else if (p1->nLangId != p2->nLangId)
				return read(p1->nLangId) - read(p2->nLangId);
			else
				return read(p1->nNameId) - read(p2->nNameId);
		}
	};

	FontNames * pTbl = (FontNames *)(pTblOld);
	uint16 crecOld = read(pTbl->count);
	uint16 ibStrOffsetOld = read(pTbl->string_offset);
	NameRecord * pOldRecord = pTbl->name_record;

	uint16 crecNew = (uint16)(crecOld + (int)(vstuExtNames.size() * vpec.size()));

	NameRecord * pNewRecord;

	// name table header
	((FontNames *)pTblNew)->format = pTbl->format;
	((FontNames *)pTblNew)->count = read(crecNew);
	uint16 ibStrOffsetNew = sizeof(FontNames) + (crecNew - 1) * sizeof(NameRecord);
	((FontNames *)pTblNew)->string_offset = read(ibStrOffsetNew);

    pNewRecord = ((FontNames *)pTblNew)->name_record;

	uint8 * pbNextString = pTblNew + ibStrOffsetNew;
	uint16 dibNew = 0; // delta offset

	utf16 rgch16[512];	// buffer for converting between wchar_t and utf16;

	// First copy the old records, changing any font names as needed.

	int ipec;

#ifndef NDEBUG
	for (ipec = 0; ipec < signed(vpec.size()) - 1; ipec++)
	{
		Assert((vpec[ipec].platformID < vpec[ipec + 1].platformID)
				|| (vpec[ipec].platformID == vpec[ipec + 1].platformID
					&& (vpec[ipec].encodingID < vpec[ipec + 1].encodingID ||
					    (vpec[ipec].encodingID == vpec[ipec + 1].encodingID &&
					     vpec[ipec].engLangID < vpec[ipec+1].engLangID))));
	}
#endif

	ipec = 0;
	int irec = 0; // scope of this variable is larger than for-loop below.
	for ( ; irec < crecOld; irec++)
	{
		PlatEncChange * ppec = &(vpec[ipec]);
		while(ipec < signed(vpec.size())
			&& (ppec->platformID < read(pOldRecord[irec].platform_id)
				|| (ppec->platformID == read(pOldRecord[irec].platform_id)
					&& ppec->encodingID < read(pOldRecord[irec].platform_specific_id))))
		{
			ipec++;
			ppec = &(vpec[ipec]);
		}

		pNewRecord[irec].platform_id = pOldRecord[irec].platform_id;
		pNewRecord[irec].platform_specific_id = pOldRecord[irec].platform_specific_id;
		pNewRecord[irec].language_id = pOldRecord[irec].language_id;
		pNewRecord[irec].name_id = pOldRecord[irec].name_id;
		pNewRecord[irec].length = pOldRecord[irec].length;
		//pNewRecord[irec].offset = ibStrOffsetNew + dibNew;

		size_t cchwStr = 0;
        uint16 cbStr = 0;
		uint8 * pbStr = NULL;
		if (ipec < signed(vpec.size())
			&& !ppec->stuFullName.empty() // this is a platform+encoding where we need to change the font
			&& ppec->platformID == read(pOldRecord[irec].platform_id)
			&& ppec->encodingID == read(pOldRecord[irec].platform_specific_id)
			&& ppec->engLangID == read(pOldRecord[irec].language_id))
		{
			uint16 nameID = read(pOldRecord[irec].name_id);
			switch (nameID)
			{
			case n_family:
			case n_preferredfamily:
				pbStr = (uint8 *)pchwFamilyName;
				cchwStr = cchwFamilyName;
				break;
			case n_fullname:
			case n_compatiblefull:
				pbStr = (uint8 *)vpec[ipec].stuFullName.data();
				cchwStr = vpec[ipec].stuFullName.length();
				break;
			case n_uniquename:
				pbStr = (uint8 *)vpec[ipec].stuUniqueName.data();
				cchwStr = vpec[ipec].stuUniqueName.length();
				break;
			case n_postscript:
				pbStr = (uint8 *)vpec[ipec].stuPostscriptName.data();
				cchwStr = vpec[ipec].stuPostscriptName.length();
				break;
			default:
				break;
			}
		}
		if (pbStr)
		{
			// Copy in the new string.
			cbStr = (uint16)(cchwStr * (vpec[ipec].cbBytesPerChar));
			pNewRecord[irec].length = read(cbStr);
			if (ppec->cbBytesPerChar == sizeof(utf16))
			{
				memcpy(pbNextString, pbStr, cbStr);
				TtfUtil::SwapWString(pbNextString, cbStr / sizeof(utf16)); // make big endian
			}
			else
			{
				// TODO: properly handle Macintosh encoding
				Platform_UnicodeToANSI((utf16 *)pbStr, cchwStr, (char *)pbNextString, cchwStr);
			}
		}
		else
		{
			// Copy the old string.
			cbStr = read(pOldRecord[irec].length);
			pbStr = pTblOld + ibStrOffsetOld + read(pOldRecord[irec].offset);
			memcpy(pbNextString, pbStr, cbStr);
		}
		pNewRecord[irec].offset = read(dibNew);
		dibNew += cbStr;
		pbNextString += cbStr;
	}

	// Then add the feature strings. Do this for all platform-encodings of interest.
	// The first time through, store the string data in the buffer and record the offsets
	// (do this once for 8-bit versions and once for 16-bit). For any subsequent platforms
	// and encodings, just use the same offsets.

	std::vector<uint16> vdibOffsets8, vdibOffsets16;
	bool fStringsStored8 = false;
	bool fStringsStored16 = false;
	for (ipec = 0; ipec < signed(vpec.size()); ipec++)
	{
		PlatEncChange * ppec = &(vpec[ipec]);
		bool f8bit = (ppec->cbBytesPerChar != sizeof(utf16));
		for (size_t istring = 0; istring < vstuExtNames.size(); istring++)
		{
			pNewRecord[irec].platform_id = read(ppec->platformID);
			pNewRecord[irec].platform_specific_id = read(ppec->encodingID);
			pNewRecord[irec].language_id = read(vnLangIds[istring]);
			pNewRecord[irec].name_id = read(vnNameTblIds[istring]);
			uint16 cbStr = (uint16)(vstuExtNames[istring].length() * ppec->cbBytesPerChar);

			// Convert the language IDs appropriately for the platform.
			uint16 platform_id = pNewRecord[irec].platform_id;
			uint16 specific_id = pNewRecord[irec].platform_specific_id;
			uint16 language_id = pNewRecord[irec].language_id;
#if !WORDS_BIGENDIAN
			platform_id = rev16(platform_id);
			specific_id = rev16(specific_id);
			language_id = rev16(language_id);
#endif
			if (platform_id == NameRecord::Macintosh && specific_id == 0) // Roman
			{
				// TODO: Convert common Windows language codes to Macintosh
				if (language_id != LG_USENG)
				{
					g_errorList.AddWarning(5506, NULL,
						"Windows language ID ", std::to_string(language_id),
						" cannot be converted to Macintosh; 0 (English) will be used");
				}
				pNewRecord[irec].language_id = 0;	// Macintosh English
			}
			else if (platform_id == 0 && specific_id == 3) // Unicode, >= 2.0
			{
				if (language_id != LG_USENG)
				{
					g_errorList.AddWarning(5507, NULL,
						"Windows language ID ", std::to_string(language_id),
						" cannot be translated to Unicode 2.0; language 0 will be used");
				}
				pNewRecord[irec].language_id = 0;	// whatever, this is our best guess
			}

			// Convert from wchar_t to 16-bit chars.
			std::wstring stuWchar = vstuExtNames[istring];
			std::copy(stuWchar.data(), stuWchar.data() + stuWchar.length(), rgch16);

			if (f8bit && !fStringsStored8)
			{
				vdibOffsets8.push_back(dibNew);
				// TODO: properly handle Macintosh encoding
				Platform_UnicodeToANSI(rgch16, cbStr, (char *)pbNextString, cbStr);
				dibNew += cbStr;
				pbNextString += cbStr;
			}
			else if (!f8bit && !fStringsStored16)
			{
				vdibOffsets16.push_back(dibNew);
				memcpy(pbNextString, rgch16, cbStr);
				TtfUtil::SwapWString(pbNextString, cbStr / sizeof(utf16)); // make big endian
				dibNew += cbStr;
				pbNextString += cbStr;
			}
			// else the string has already been stored, and we've saved the offset.

			pNewRecord[irec].length = read(cbStr);
			pNewRecord[irec].offset = (f8bit) ?
				read(vdibOffsets8[istring]):
				read(vdibOffsets16[istring]);
			irec++;
		}

		(f8bit) ?
			fStringsStored8 = true:
			fStringsStored16 = true;
	}

	Assert(irec == crecNew);

	// Sort list of entries.
	::qsort(reinterpret_cast<NameTblEntry *>(pNewRecord), crecNew, sizeof(NameTblEntry), NameTblEntry::Compare);

	return true;
}